

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::
Section9InvalidRequireExplicitPolicyTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::~Section9InvalidRequireExplicitPolicyTest3
          (Section9InvalidRequireExplicitPolicyTest3<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest09RequireExplicitPolicy,
                     Section9InvalidRequireExplicitPolicyTest3) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "requireExplicitPolicy4CACert",
                               "requireExplicitPolicy4subCACert",
                               "requireExplicitPolicy4subsubCACert",
                               "requireExplicitPolicy4subsubsubCACert",
                               "InvalidrequireExplicitPolicyTest3EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "requireExplicitPolicy4CACRL",
      "requireExplicitPolicy4subCACRL", "requireExplicitPolicy4subsubCACRL",
      "requireExplicitPolicy4subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.9.3";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}